

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowCleanMarkB_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  
  if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) != 0) {
    *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf;
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                    ,0x391,"void Llb_ManFlowCleanMarkB_rec(Aig_Obj_t *)");
    }
    pAVar2 = Aig_ObjFanin0(pObj);
    Llb_ManFlowCleanMarkB_rec(pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Llb_ManFlowCleanMarkB_rec(pAVar2);
  }
  return;
}

Assistant:

void Llb_ManFlowCleanMarkB_rec( Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB == 0 )
        return;
    pObj->fMarkB = 0;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowCleanMarkB_rec( Aig_ObjFanin0(pObj) );
    Llb_ManFlowCleanMarkB_rec( Aig_ObjFanin1(pObj) );
}